

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2espec.cc
# Opt level: O3

void e2e_fdb_set_person(storage_t *st,person_t *p)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  size_t valuelen;
  size_t keylen;
  btree *pbVar4;
  __atomic_base<unsigned_long> __s2;
  btree_kv_ops *__s1;
  bool bVar5;
  fdb_status fVar6;
  fdb_status fVar7;
  int iVar8;
  size_t sVar9;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar10;
  __atomic_base<unsigned_long> _Var11;
  _func_voidref_void_ptr_bid_t_ptr *p_Var12;
  _func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *p_Var13;
  checkpoint_t *pcVar14;
  list_elem *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar15;
  filemgr *__ptr;
  undefined4 uVar16;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  fdb_doc *pfVar18;
  checkpoint_t *handle_in;
  fdb_kvs_handle *pfVar19;
  fdb_kvs_handle *pfVar20;
  char *unaff_R12;
  char *pcVar21;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar22;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *unaff_R13;
  long lVar23;
  list *plVar24;
  void **doc;
  timeval __test_begin;
  fdb_snapshot_info_t *pfStackY_470;
  uint64_t uStackY_468;
  list_elem *plStackY_460;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_458;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_450;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_440;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_438;
  timeval tStackY_430;
  checkpoint_t *pcStackY_420;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_418;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStackY_410;
  fdb_kvs_handle *pfStackY_408;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStackY_400;
  filemgr *pfStackY_3f8;
  fdb_doc *pfStack_3e0;
  fdb_iterator *pfStack_3d8;
  list_elem lStack_3d0;
  idx_prams_t iStack_3c0;
  timeval tStack_3a8;
  fdb_kvs_handle *pfStack_398;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_390;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_388;
  checkpoint_t *pcStack_380;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_378;
  filemgr *pfStack_370;
  fdb_doc *pfStack_360;
  timeval tStack_358;
  undefined1 auStack_348 [48];
  char acStack_318 [264];
  fdb_kvs_handle *pfStack_210;
  checkpoint_t *pcStack_208;
  fdb_doc *pfStack_1f8;
  timeval tStack_1f0;
  atomic<unsigned_long> aStack_1e0;
  fdb_kvs_handle *pfStack_1d8;
  atomic<unsigned_long> aStack_1d0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c0;
  filemgr *pfStack_1b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1b0;
  fdb_iterator *pfStack_1a8;
  char acStack_19c [4];
  fdb_kvs_handle *pfStack_198;
  fdb_kvs_handle *pfStack_190;
  fdb_kvs_handle *pfStack_188;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_180;
  size_t sStack_178;
  timeval tStack_170;
  fdb_kvs_info fStack_160;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_130;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_128;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_120;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_118;
  void **ppvStack_110;
  filemgr *pfStack_108;
  fdb_doc *pfStack_f8;
  timeval tStack_f0;
  ulong uStack_e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_d8;
  void **appvStack_d0 [2];
  timeval tStack_c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_a8;
  fdb_doc *pfStack_98;
  timeval tStack_90;
  storage_t *psStack_80;
  char *pcStack_78;
  person_t *ppStack_70;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_68;
  code *pcStack_60;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_48;
  timeval local_40;
  
  pcStack_60 = (code *)0x10961a;
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  paVar22 = &local_48;
  local_48.seqtree = (btree *)0x0;
  pcStack_60 = (code *)0x109636;
  strcpy(p->keyspace,st->keyspace);
  pcStack_60 = (code *)0x10963e;
  sVar9 = strlen(p->key);
  pcStack_60 = (code *)0x10965c;
  fdb_doc_create((fdb_doc **)&paVar22->seqtree,p,sVar9,(void *)0x0,0,p,0xe0c);
  pcStack_60 = (code *)0x109668;
  fVar6 = fdb_get(st->all_docs,(fdb_doc *)local_48.seqtree);
  paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)st->all_docs;
  pcStack_60 = (code *)0x109676;
  aVar17 = local_48;
  fVar7 = fdb_set((fdb_kvs_handle *)paVar15,(fdb_doc *)local_48.seqtree);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    paVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)st->index1;
    unaff_R12 = p->name;
    pcStack_60 = (code *)0x109691;
    sVar9 = strlen(unaff_R12);
    valuelen._0_1_ = *(uint8_t *)local_48;
    valuelen._1_1_ = *(uint8_t *)((long)local_48 + 1);
    valuelen._2_2_ = *(uint16_t *)((long)local_48 + 2);
    valuelen._4_4_ = *(uint32_t *)((long)local_48 + 4);
    pcStack_60 = (code *)0x1096ab;
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)unaff_R12;
    paVar15 = paVar22;
    fVar7 = fdb_set_kv((fdb_kvs_handle *)paVar22,unaff_R12,sVar9,(local_48.seqtree)->kv_ops,valuelen
                      );
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00109791;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)st->index2;
    pcStack_60 = (code *)0x1096bf;
    sVar9 = strlen(unaff_R12);
    paVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&p->age;
    pcStack_60 = (code *)0x1096dd;
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)unaff_R12;
    paVar15 = unaff_R13;
    fVar7 = fdb_set_kv((fdb_kvs_handle *)unaff_R13,unaff_R12,sVar9,paVar22,4);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_00109796;
    keylen._0_1_ = *(uint8_t *)local_48;
    keylen._1_1_ = *(uint8_t *)((long)local_48 + 1);
    keylen._2_2_ = *(uint16_t *)((long)local_48 + 2);
    keylen._4_4_ = *(uint32_t *)((long)local_48 + 4);
    pcStack_60 = (code *)0x1096fe;
    save_tx(st,(local_48.seqtree)->kv_ops,keylen,1);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00109773;
    pcStack_60 = (code *)0x10970e;
    bVar5 = is_indexed(st->index_params,p);
    if (!bVar5) {
LAB_00109769:
      piVar1 = &st->v_chk->ndocs;
      *piVar1 = *piVar1 + 1;
LAB_00109773:
      pcStack_60 = (code *)0x10977d;
      fdb_doc_free((fdb_doc *)local_48.seqtree);
      return;
    }
    pcVar14 = st->v_chk;
    uVar2 = pcVar14->num_indexed;
    uVar3 = pcVar14->sum_age_indexed;
    iVar8 = *(int *)paVar22;
    pcVar14->num_indexed = uVar2 + 1;
    pcVar14->sum_age_indexed = iVar8 + uVar3;
    pcStack_60 = (code *)0x109749;
    free((void *)local_48.seqtree[1].root_bid);
    local_48.seqtree[1].root_bid = 0;
    if (st->verify_set != true) goto LAB_00109769;
    paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)st->all_docs;
    pcStack_60 = (code *)0x109765;
    aVar17 = local_48;
    fVar7 = fdb_get((fdb_kvs_handle *)paVar15,(fdb_doc *)local_48.seqtree);
    if (fVar7 == FDB_RESULT_SUCCESS) goto LAB_00109769;
  }
  else {
    pcStack_60 = (code *)0x109791;
    e2e_fdb_set_person_cold_1();
LAB_00109791:
    pcStack_60 = (code *)0x109796;
    e2e_fdb_set_person_cold_2();
LAB_00109796:
    pcStack_60 = (code *)0x10979b;
    e2e_fdb_set_person_cold_3();
  }
  pcStack_60 = e2e_fdb_del_person;
  e2e_fdb_set_person_cold_4();
  pcVar21 = (char *)0x0;
  paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1097c1;
  psStack_80 = st;
  pcStack_78 = unaff_R12;
  ppStack_70 = p;
  paStack_68 = paVar22;
  pcStack_60 = (code *)(ulong)(uint)fVar6;
  gettimeofday(&tStack_90,(__timezone_ptr_t)0x0);
  doc = &pfStack_98;
  pfStack_98 = (fdb_doc *)0x0;
  paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1097d1;
  sVar9 = strlen((char *)aVar17.seqtree);
  paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1097eb;
  fdb_doc_create((fdb_doc **)doc,aVar17.seqtree,sVar9,(void *)0x0,0,(void *)0x0,0);
  paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1097f7;
  fVar6 = fdb_get((fdb_kvs_handle *)paVar15[1].seqtree,pfStack_98);
  __ptr = (filemgr *)(ulong)(uint)fVar6;
  aVar10 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)paVar15[1].seqtree;
  paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x109805;
  pfVar18 = pfStack_98;
  fVar7 = fdb_del((fdb_kvs_handle *)aVar10.seqtree,pfStack_98);
  if (fVar7 == FDB_RESULT_SUCCESS) {
    pcVar21 = (char *)paVar15[2].seqtree;
    doc = &aVar17.seqtree[0x12].blk_handle;
    paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x109820;
    sVar9 = strlen((char *)doc);
    paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x10982e;
    pfVar18 = (fdb_doc *)doc;
    aVar10 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
    fVar7 = fdb_del_kv((fdb_kvs_handle *)pcVar21,doc,sVar9);
    if (fVar7 != FDB_RESULT_SUCCESS) goto LAB_001098b9;
    pcVar21 = (char *)paVar15[3].seqtree;
    paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x109842;
    sVar9 = strlen((char *)doc);
    paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x109850;
    pfVar18 = (fdb_doc *)doc;
    aVar10 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
    fVar7 = fdb_del_kv((fdb_kvs_handle *)pcVar21,doc,sVar9);
    if (fVar7 == FDB_RESULT_SUCCESS) {
      paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x10986d;
      save_tx((storage_t *)paVar15,pfStack_98->key,pfStack_98->keylen,2);
      if (fVar6 == FDB_RESULT_SUCCESS) {
        paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x10987d;
        bVar5 = is_indexed((idx_prams_t *)paVar15[8].seqtree,(person_t *)aVar17.seqtree);
        pbVar4 = paVar15[7].seqtree;
        if (bVar5) {
          piVar1 = (int *)((long)&pbVar4[0x12].blk_handle + 4);
          *piVar1 = *piVar1 + -1;
          *(int *)&pbVar4[0x12].blk_ops =
               *(int *)&pbVar4[0x12].blk_ops - (int)aVar17.seqtree[0x40].root_bid;
        }
        *(int *)&pbVar4[0x12].blk_handle = *(int *)&pbVar4[0x12].blk_handle + -1;
      }
      paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1098a7;
      fdb_doc_free(pfStack_98);
      return;
    }
  }
  else {
    paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1098b9;
    e2e_fdb_del_person_cold_1();
LAB_001098b9:
    paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x1098be;
    e2e_fdb_del_person_cold_2();
  }
  paStack_a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)e2e_fdb_commit;
  e2e_fdb_del_person_cold_3();
  appvStack_d0[0] = (void **)0x1098db;
  aStack_b0 = aVar17;
  paStack_a8 = paVar15;
  gettimeofday(&tStack_c0,(__timezone_ptr_t)0x0);
  appvStack_d0[0] = (void **)0x1098e5;
  aVar17 = aVar10;
  fVar6 = fdb_commit((fdb_file_handle *)aVar10.seqtree,(fdb_commit_opt_t)pfVar18);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    return;
  }
  appvStack_d0[0] = (void **)start_checkpoint;
  e2e_fdb_commit_cold_1();
  pfStack_108 = (filemgr *)0x10990e;
  uStack_e0 = (ulong)pfVar18 & 0xffffffff;
  aStack_d8 = aVar10;
  appvStack_d0[0] = doc;
  gettimeofday(&tStack_f0,(__timezone_ptr_t)0x0);
  pfStack_f8 = (fdb_doc *)0x0;
  pfVar19 = (fdb_kvs_handle *)(aVar17.seqtree)->kv_ops;
  uVar16._0_1_ = '\x02';
  uVar16._1_1_ = '\0';
  uVar16._2_1_ = '\0';
  uVar16._3_1_ = '\0';
  pfStack_108 = (filemgr *)0x109925;
  fVar6 = fdb_begin_transaction((fdb_file_handle *)pfVar19,'\x02');
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfStack_108 = (filemgr *)0x109936;
    aVar10.seqtree = (btree *)create_checkpoint(aVar17.seqtree,5);
    pfStack_108 = (filemgr *)0x109941;
    sVar9 = strlen((char *)aVar10.seqtree);
    doc = &pfStack_f8;
    pfStack_108 = (filemgr *)0x109964;
    fdb_doc_create((fdb_doc **)doc,aVar10.seqtree,sVar9,(void *)0x0,0,aVar10.seqtree,0x430);
    pfStack_108 = (filemgr *)0x10997b;
    save_tx((storage_t *)aVar17.seqtree,pfStack_f8->key,pfStack_f8->keylen,5);
    pfVar19 = (fdb_kvs_handle *)(aVar17.seqtrie)->btree_kv_ops;
    pfStack_108 = (filemgr *)0x109987;
    pfVar18 = pfStack_f8;
    fVar6 = fdb_set(pfVar19,pfStack_f8);
    uVar16 = SUB84(pfVar18,0);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_108 = (filemgr *)0x109993;
      free(aVar10.seqtree);
      pfStack_108 = (filemgr *)0x10999d;
      fdb_doc_free(pfStack_f8);
      return;
    }
  }
  else {
    pfStack_108 = (filemgr *)0x1099ac;
    start_checkpoint_cold_1();
  }
  pfStack_108 = (filemgr *)create_checkpoint;
  start_checkpoint_cold_2();
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099d7;
  acStack_19c = (char  [4])uVar16;
  aStack_130 = aVar17;
  aStack_128 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
  paStack_120 = unaff_R13;
  aStack_118 = aVar10;
  ppvStack_110 = doc;
  pfStack_108 = __ptr;
  gettimeofday(&tStack_170,(__timezone_ptr_t)0x0);
  aStack_1c0.seqtree = (btree *)0x0;
  __s2._M_i = (__int_type)(pfVar19->field_6).seqtree;
  pfStack_1b8 = (filemgr *)0x0;
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x1099f4;
  _Var11._M_i = (__int_type)calloc(1,0x430);
  pfVar20 = (fdb_kvs_handle *)pfVar19->trie;
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a05;
  fVar6 = fdb_get_kvs_info(pfVar20,&fStack_160);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    aStack_1b0.seqtree = (btree *)(__s2._M_i + 0xc);
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a23;
    e2e_fdb_commit(*(fdb_file_handle **)&pfVar19->kvs_config,*(bool *)((long)&pfVar19->file + 6));
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a32;
    p_Var12 = (_func_voidref_void_ptr_bid_t_ptr *)
              last_snap_seqnum((storage_t *)pfVar19,"e2ekv_alldocs");
    ((btree_blk_ops *)(_Var11._M_i + 0x410))->blk_alloc = p_Var12;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a48;
    p_Var12 = (_func_voidref_void_ptr_bid_t_ptr *)
              last_snap_seqnum((storage_t *)pfVar19,"e2ekv_index1");
    *(_func_voidref_void_ptr_bid_t_ptr **)(_Var11._M_i + 0x418) = p_Var12;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a5e;
    p_Var13 = (_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr *)
              last_snap_seqnum((storage_t *)pfVar19,"e2ekv_index2");
    *(_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr **)(_Var11._M_i + 0x420) = p_Var13;
    lVar23 = 0;
    __ptr = (filemgr *)0x8421084210842109;
    pcVar21 = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";
    do {
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109a7e;
      iVar8 = rand();
      *(char *)(_Var11._M_i + lVar23) =
           "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"
           [(ulong)(long)iVar8 % 0x3e];
      lVar23 = lVar23 + 1;
    } while (lVar23 != 0xc);
    *(undefined1 *)(_Var11._M_i + 0xb) = 0;
    *(undefined4 *)(_Var11._M_i + 0x400) = (undefined4)fStack_160.doc_count;
    *(undefined2 *)(_Var11._M_i + 0x40c) = 0;
    *(short *)(_Var11._M_i + 0x428) = acStack_19c._0_2_;
    pfVar20 = (fdb_kvs_handle *)(pfVar19->kvs_config).custom_cmp;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ae6;
    fVar6 = fdb_snapshot_open(pfVar20,&pfStack_198,
                              (fdb_seqnum_t)((btree_blk_ops *)(_Var11._M_i + 0x410))->blk_alloc);
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0xc;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109cc9;
    pfVar20 = (fdb_kvs_handle *)(pfVar19->kvs_config).custom_cmp_param;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b03;
    fVar6 = fdb_snapshot_open(pfVar20,&pfStack_188,
                              (fdb_seqnum_t)
                              *(_func_voidref_void_ptr_bid_t_ptr **)(_Var11._M_i + 0x418));
    pcVar21 = (char *)aStack_1b0;
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109cce;
    pfVar20 = (fdb_kvs_handle *)pfVar19->kvs;
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b25;
    fVar6 = fdb_snapshot_open(pfVar20,&pfStack_190,
                              (fdb_seqnum_t)
                              *(_func_voidref_void_ptr_bid_t_size_t_bid_t_ptr **)
                               (_Var11._M_i + 0x420));
    if (fVar6 == FDB_RESULT_SUCCESS) {
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109b54;
      fVar6 = fdb_iterator_init(pfStack_188,&pfStack_1a8,(void *)__s2._M_i,0xc,pcVar21,0xc,2);
      if (fVar6 == FDB_RESULT_SUCCESS) {
        pfVar19 = (fdb_kvs_handle *)&pfVar19->file;
        unaff_R13 = &aStack_1c0;
        do {
          aStack_1d0.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109b75;
          fVar6 = fdb_iterator_get(pfStack_1a8,(fdb_doc **)&unaff_R13->seqtree);
          pcVar21 = (char *)aStack_1c0;
          if (fVar6 == FDB_RESULT_SUCCESS) {
            __s1 = (aStack_1c0.seqtree)->kv_ops;
            aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109b92;
            iVar8 = strcmp((char *)__s1,(char *)__s2._M_i);
            if (iVar8 < 0) {
LAB_00109c55:
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c6a;
              create_checkpoint_cold_5();
              pcVar21 = (char *)aStack_180;
            }
            else {
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109ba7;
              iVar8 = strcmp((char *)__s1,(char *)aStack_1b0.seqtree);
              if (0 < iVar8) goto LAB_00109c55;
            }
            aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109bcd;
            fVar6 = fdb_get_kv(pfStack_198,
                               ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                               &((hbtrie *)pcVar21)->readkey)->seqtree,
                               (size_t)((btree *)pcVar21)->blk_handle,&pfStack_1b8,&sStack_178);
            __ptr = pfStack_1b8;
            if (fVar6 == FDB_RESULT_SUCCESS) {
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109be5;
              iVar8 = strcmp((char *)(pfStack_1b8[4].encryption.key.bytes + 4),(char *)pfVar19);
              if (iVar8 == 0) {
                *(int *)(_Var11._M_i + 0x404) = *(int *)(_Var11._M_i + 0x404) + 1;
                aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                     (__atomic_base<unsigned_long>)0x109bfe;
                pfVar20 = pfStack_190;
                fVar6 = fdb_get(pfStack_190,(fdb_doc *)aStack_1c0.seqtree);
                if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109cd8;
                *(int *)(_Var11._M_i + 0x408) =
                     *(int *)(_Var11._M_i + 0x408) +
                     *(int *)((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             &(aStack_1c0.seqtrie)->readkey)->seqtree;
                __ptr = pfStack_1b8;
              }
              aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                   (__atomic_base<unsigned_long>)0x109c24;
              free(__ptr);
              pfStack_1b8 = (filemgr *)0x0;
            }
            aStack_1d0.super___atomic_base<unsigned_long>._M_i =
                 (__atomic_base<unsigned_long>)0x109c37;
            fdb_doc_free((fdb_doc *)aStack_1c0.seqtree);
            aStack_1c0.seqtree = (btree *)0x0;
          }
          aStack_1d0.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)0x109c4a;
          fVar6 = fdb_iterator_next(pfStack_1a8);
          aVar17 = aStack_1c0;
        } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
      }
      else {
        aVar17.seqtree = (btree *)0x0;
      }
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c7e;
      fdb_doc_free((fdb_doc *)aVar17.seqtree);
      aStack_1c0.seqtree = (btree *)0x0;
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c91;
      fdb_iterator_close(pfStack_1a8);
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109c9b;
      fdb_kvs_close(pfStack_198);
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109ca5;
      fdb_kvs_close(pfStack_188);
      aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109caf;
      fdb_kvs_close(pfStack_190);
      return;
    }
  }
  else {
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cc9;
    create_checkpoint_cold_1();
LAB_00109cc9:
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cce;
    create_checkpoint_cold_2();
LAB_00109cce:
    aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cd3;
    create_checkpoint_cold_3();
  }
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0x109cd8;
  create_checkpoint_cold_4();
LAB_00109cd8:
  aStack_1d0.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)end_checkpoint;
  create_checkpoint_cold_6();
  pcStack_208 = (checkpoint_t *)0x109cf5;
  aStack_1e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var11._M_i;
  pfStack_1d8 = pfVar19;
  aStack_1d0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)__s2._M_i;
  gettimeofday(&tStack_1f0,(__timezone_ptr_t)0x0);
  pfStack_1f8 = (fdb_doc *)0x0;
  pcStack_208 = (checkpoint_t *)0x109d0e;
  pcVar14 = create_checkpoint((storage_t *)pfVar20,6);
  pcStack_208 = (checkpoint_t *)0x109d19;
  sVar9 = strlen(pcVar14->key);
  pcStack_208 = (checkpoint_t *)0x109d37;
  fdb_doc_create(&pfStack_1f8,pcVar14,sVar9,(void *)0x0,0,pcVar14,0x430);
  pcStack_208 = (checkpoint_t *)0x109d4e;
  save_tx((storage_t *)pfVar20,pfStack_1f8->key,pfStack_1f8->keylen,6);
  pfVar19 = (fdb_kvs_handle *)pfVar20->op_stats;
  pcStack_208 = (checkpoint_t *)0x109d5b;
  fVar6 = fdb_end_transaction((fdb_file_handle *)pfVar19,
                              *(fdb_commit_opt_t *)((long)&pfVar20->file + 6));
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfVar19 = (fdb_kvs_handle *)pfVar20->trie;
    pcStack_208 = (checkpoint_t *)0x109d6d;
    fVar6 = fdb_set(pfVar19,pfStack_1f8);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pcStack_208 = (checkpoint_t *)0x109d79;
      free(pcVar14);
      pcStack_208 = (checkpoint_t *)0x109d83;
      fdb_doc_free(pfStack_1f8);
      return;
    }
  }
  else {
    pcStack_208 = (checkpoint_t *)0x109d92;
    end_checkpoint_cold_1();
  }
  pcStack_208 = (checkpoint_t *)e2e_fdb_cancel_checkpoint;
  end_checkpoint_cold_2();
  pfStack_370 = (filemgr *)0x109db0;
  pfStack_210 = pfVar20;
  pcStack_208 = pcVar14;
  gettimeofday(&tStack_358,(__timezone_ptr_t)0x0);
  pfStack_360 = (fdb_doc *)0x0;
  pfVar20 = (fdb_kvs_handle *)
            (((atomic<unsigned_long> *)&pfVar19->trie)->super___atomic_base<unsigned_long>)._M_i;
  handle_in = (checkpoint_t *)auStack_348;
  pfStack_370 = (filemgr *)0x109dc7;
  fVar6 = fdb_get_kvs_info(pfVar20,(fdb_kvs_info *)handle_in);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    pfVar20 = (fdb_kvs_handle *)&pfStack_360;
    handle_in = (checkpoint_t *)0x0;
    pfStack_370 = (filemgr *)0x109ded;
    fVar6 = fdb_doc_create((fdb_doc **)pfVar20,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109eec;
    pfStack_360->seqnum = auStack_348._8_8_;
    pfStack_370 = (filemgr *)0x109e0c;
    fdb_get_byseq((fdb_kvs_handle *)
                  (((atomic<unsigned_long> *)&pfVar19->trie)->super___atomic_base<unsigned_long>).
                  _M_i,pfStack_360);
    pcVar14 = (checkpoint_t *)pfStack_360->body;
    if (pcVar14->type != 5) {
      pfStack_370 = (filemgr *)0x109e2c;
      e2e_fdb_cancel_checkpoint_cold_3();
    }
    pfVar20 = (fdb_kvs_handle *)&(pfVar19->kvs_config).custom_cmp;
    handle_in = (checkpoint_t *)pcVar14->seqnum_all;
    pfStack_370 = (filemgr *)0x109e3c;
    fVar6 = fdb_rollback((fdb_kvs_handle **)pfVar20,(fdb_seqnum_t)handle_in);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109ef1;
    pfVar20 = (fdb_kvs_handle *)&(pfVar19->kvs_config).custom_cmp_param;
    handle_in = (checkpoint_t *)pcVar14->seqnum_idx1;
    pfStack_370 = (filemgr *)0x109e54;
    fVar6 = fdb_rollback((fdb_kvs_handle **)pfVar20,(fdb_seqnum_t)handle_in);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109ef6;
    pfVar20 = (fdb_kvs_handle *)&pfVar19->kvs;
    handle_in = (checkpoint_t *)pcVar14->seqnum_idx2;
    pfStack_370 = (filemgr *)0x109e6c;
    fVar6 = fdb_rollback((fdb_kvs_handle **)pfVar20,(fdb_seqnum_t)handle_in);
    if (fVar6 != FDB_RESULT_SUCCESS) goto LAB_00109efb;
    pfStack_370 = (filemgr *)0x109e85;
    handle_in = pcVar14;
    memcpy(pfVar19->staletree,pcVar14,0x430);
    pfVar20 = (fdb_kvs_handle *)
              (((atomic<unsigned_long> *)&pfVar19->op_stats)->super___atomic_base<unsigned_long>).
              _M_i;
    pfStack_370 = (filemgr *)0x109e8e;
    fVar6 = fdb_abort_transaction((fdb_file_handle *)pfVar20);
    if (fVar6 == FDB_RESULT_SUCCESS) {
      pfStack_370 = (filemgr *)0x109eaf;
      sprintf(auStack_348 + 0x30,"revert to checkpoint[seqno:%lu]\n",pcVar14->seqnum_all);
      pcVar21 = "%s PASSED\n";
      if (e2e_fdb_cancel_checkpoint::__test_pass != '\0') {
        pcVar21 = "%s FAILED\n";
      }
      pfStack_370 = (filemgr *)0x109edc;
      fprintf(_stderr,pcVar21,auStack_348 + 0x30);
      return;
    }
  }
  else {
    pfStack_370 = (filemgr *)0x109eec;
    e2e_fdb_cancel_checkpoint_cold_1();
LAB_00109eec:
    pfStack_370 = (filemgr *)0x109ef1;
    e2e_fdb_cancel_checkpoint_cold_2();
LAB_00109ef1:
    pfStack_370 = (filemgr *)0x109ef6;
    e2e_fdb_cancel_checkpoint_cold_4();
LAB_00109ef6:
    pfStack_370 = (filemgr *)0x109efb;
    e2e_fdb_cancel_checkpoint_cold_5();
LAB_00109efb:
    pfStack_370 = (filemgr *)0x109f00;
    e2e_fdb_cancel_checkpoint_cold_6();
  }
  pfStack_370 = (filemgr *)scan;
  e2e_fdb_cancel_checkpoint_cold_7();
  pfStackY_3f8 = (filemgr *)0x109f25;
  pfStack_398 = pfVar19;
  aStack_390 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
  paStack_388 = unaff_R13;
  pcStack_380 = pcVar14;
  aStack_378.seqtree = (btree *)&pfStack_1f8;
  pfStack_370 = __ptr;
  gettimeofday(&tStack_3a8,(__timezone_ptr_t)0x0);
  pfStack_3e0 = (fdb_doc *)0x0;
  pfStackY_3f8 = (filemgr *)0x109f38;
  gen_index_params(&iStack_3c0);
  if (handle_in != (checkpoint_t *)0x0) {
    pfStackY_3f8 = (filemgr *)0x109f51;
    fVar6 = fdb_snapshot_open((fdb_kvs_handle *)handle_in,(fdb_kvs_handle **)&lStack_3d0,
                              0xffffffffffffffff);
    if (fVar6 == FDB_RESULT_SUCCESS) goto LAB_00109f77;
    pfStackY_3f8 = (filemgr *)0x109f5a;
    scan_cold_1();
  }
  paVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(pfVar20->kvs_config).custom_cmp_param;
  ptr_handle = &lStack_3d0;
  pfStackY_3f8 = (filemgr *)0x109f6f;
  fVar6 = fdb_snapshot_open((fdb_kvs_handle *)paVar22,(fdb_kvs_handle **)ptr_handle,
                            0xffffffffffffffff);
  if (fVar6 != FDB_RESULT_SUCCESS) {
    pfStackY_3f8 = (filemgr *)last_snap_seqnum;
    scan_cold_2();
    aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a070;
    pcStackY_420 = handle_in;
    aStackY_418 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar21;
    paStackY_410 = unaff_R13;
    pfStackY_408 = pfVar20;
    aStackY_400.seqtree = (btree *)&pfStack_1f8;
    pfStackY_3f8 = __ptr;
    gettimeofday(&tStackY_430,(__timezone_ptr_t)0x0);
    aVar17 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)paVar22->seqtree;
    paVar15 = &aStackY_440;
    aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a082;
    fVar6 = fdb_get_all_snap_markers
                      ((fdb_file_handle *)aVar17.seqtree,(fdb_snapshot_info_t **)&paVar15->seqtree,
                       (uint64_t *)&paStackY_438);
    paStackY_458 = paVar22;
    aVar10.seqtree = (btree *)&pfStack_1f8;
    if (fVar6 == FDB_RESULT_SUCCESS) {
      if (paStackY_438 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
        paVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
        do {
          plVar24 = (list *)(&(aStackY_440.seqtree)->root_bid)[(long)paVar22 * 3];
          if (0 < (long)plVar24) {
            __ptr = (filemgr *)
                    &((list *)(&(aStackY_440.seqtree)->blk_handle)[(long)paVar22 * 3])->tail;
            do {
              aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0c2;
              iVar8 = strcmp(*(char **)&__ptr[-1].fhandle_idx_lock,(char *)ptr_handle);
              if (iVar8 == 0) goto LAB_0010a0eb;
              __ptr = (filemgr *)&__ptr->blocksize;
              plVar24 = (list *)((long)&plVar24[-1].tail + 7);
            } while (plVar24 != (list *)0x0);
          }
          paVar22 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)paVar22 + 1);
        } while (paVar22 != paStackY_438);
      }
      aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0e2;
      paVar15 = paStackY_438;
      aVar17 = aStackY_440;
      fVar6 = fdb_free_snap_markers
                        ((fdb_snapshot_info_t *)aStackY_440.seqtree,(uint64_t)paStackY_438);
      if (fVar6 == FDB_RESULT_SUCCESS) {
        aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0eb;
        last_snap_seqnum();
LAB_0010a0eb:
        ptr_handle = (list_elem *)__ptr->filename;
        aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a0fa;
        paVar15 = paStackY_438;
        aVar17 = aStackY_440;
        fVar6 = fdb_free_snap_markers
                          ((fdb_snapshot_info_t *)aStackY_440.seqtree,(uint64_t)paStackY_438);
        if (fVar6 == FDB_RESULT_SUCCESS) {
          return;
        }
      }
      aStackY_450 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x10a115;
      last_snap_seqnum();
      paStackY_458 = paStackY_438;
      aVar10 = aStackY_440;
    }
    aStackY_450.seqtree = (btree *)print_n_markers;
    last_snap_seqnum();
    plStackY_460 = ptr_handle;
    aStackY_450 = aVar10;
    fdb_get_all_snap_markers
              ((fdb_file_handle *)*(fdb_kvs_handle **)&(aVar17.seqtree)->ksize,&pfStackY_470,
               &uStackY_468);
    if (paVar15 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) {
      lVar23 = 0x10;
      do {
        printf("marker:  %lu\n",*(undefined8 *)(*(long *)((long)&pfStackY_470->marker + lVar23) + 8)
              );
        lVar23 = lVar23 + 0x18;
        paVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)((long)paVar15 + -1);
      } while (paVar15 != (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0);
    }
    return;
  }
LAB_00109f77:
  pfStackY_3f8 = (filemgr *)0x109fa5;
  fVar6 = fdb_iterator_init((fdb_kvs_handle *)lStack_3d0.prev,&pfStack_3d8,&iStack_3c0,0xc,
                            iStack_3c0.max,0xc,0);
  if (fVar6 == FDB_RESULT_SUCCESS) {
    do {
      pfStackY_3f8 = (filemgr *)0x109fe3;
      fVar6 = fdb_iterator_get(pfStack_3d8,&pfStack_3e0);
      pfVar18 = pfStack_3e0;
      if (fVar6 == FDB_RESULT_SUCCESS) {
        pcVar21 = (char *)pfStack_3e0->key;
        pfStackY_3f8 = (filemgr *)0x109ffb;
        iVar8 = strcmp(pcVar21,iStack_3c0.min);
        if (iVar8 < 0) {
LAB_0010a033:
          pfStackY_3f8 = (filemgr *)0x10a044;
          scan_cold_3();
          pfVar18 = (fdb_doc *)lStack_3d0.next;
        }
        else {
          pfStackY_3f8 = (filemgr *)0x10a00a;
          iVar8 = strcmp(pcVar21,iStack_3c0.max);
          if (0 < iVar8) goto LAB_0010a033;
        }
        pfStackY_3f8 = (filemgr *)0x10a016;
        fdb_doc_free(pfVar18);
        pfStack_3e0 = (fdb_doc *)0x0;
      }
      pfStackY_3f8 = (filemgr *)0x10a029;
      fVar6 = fdb_iterator_next(pfStack_3d8);
    } while (fVar6 != FDB_RESULT_ITERATOR_FAIL);
  }
  pfStackY_3f8 = (filemgr *)0x109fb3;
  fdb_iterator_close(pfStack_3d8);
  return;
}

Assistant:

void e2e_fdb_set_person(storage_t *st, person_t *p){

    TEST_INIT();
    fdb_status status;
    fdb_doc *doc = NULL;
    bool indexed;
    bool existed;

    strcpy(p->keyspace, st->keyspace);
    fdb_doc_create(&doc, p->key, strlen(p->key),
                   NULL, 0, (void *)p, sizeof(person_t));
    status = fdb_get(st->all_docs, doc);
    existed = (status == FDB_RESULT_SUCCESS);

    // main person.key -> person doc
    status = fdb_set(st->all_docs, doc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person doc
    status = fdb_set_kv(st->index1, p->name, strlen(p->name), doc->key, doc->keylen);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // index person.name -> person age
    status = fdb_set_kv(st->index2, p->name, strlen(p->name), (void *)&p->age,
                        sizeof(int));
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // update transaction db
    save_tx(st, doc->key, doc->keylen, SET_PERSON);

    if(!existed){  // new doc
        indexed = is_indexed(st->index_params, p);
        if(indexed){  // within storage index
            // update verification checkpoint
            st->v_chk->num_indexed++;
            st->v_chk->sum_age_indexed+=p->age;
            free(doc->body);
            doc->body = NULL;
            if (st->verify_set) {
                status = fdb_get(st->all_docs, doc);
                TEST_CHK(status == FDB_RESULT_SUCCESS);
            }
        }
        st->v_chk->ndocs += 1;
    }

    fdb_doc_free(doc);
    doc=NULL;

}